

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn ubxGetVersion(int fdPort,int verbosity,ubxVersion *version)

{
  ubxMsg pollMsg;
  _Bool _Var1;
  int iVar2;
  slBuffer *body_00;
  byte *source;
  char *pcVar3;
  size_t sVar4;
  char **ppcVar5;
  int local_84;
  char **ppcStack_80;
  int i;
  char **ptr;
  int ne;
  char *buf;
  slReturn result;
  ubxMsg versionMsg;
  ubxMsg msg;
  slBuffer *body;
  ubxType type;
  ubxVersion *version_local;
  int verbosity_local;
  int fdPort_local;
  
  body_00 = create_slBuffer(0,LittleEndian);
  createUbxMsg((ubxMsg *)&versionMsg.checksum,(ubxType)0x40a,body_00);
  pollMsg.body = (slBuffer *)msg._0_8_;
  pollMsg.type.class = versionMsg.checksum.ck_a;
  pollMsg.type.id = versionMsg.checksum.ck_b;
  pollMsg._2_6_ = versionMsg._18_6_;
  pollMsg._16_8_ = msg.body;
  _verbosity_local = pollUbx(fdPort,pollMsg,2000,(ubxMsg *)&result);
  _Var1 = isErrorReturn(_verbosity_local);
  if (!_Var1) {
    source = buffer_slBuffer((slBuffer *)versionMsg._0_8_);
    pcVar3 = getAllocatedStringCopy((char *)source);
    version->software = pcVar3;
    pcVar3 = getAllocatedStringCopy((char *)(source + 0x1e));
    version->hardware = pcVar3;
    sVar4 = size_slBuffer((slBuffer *)versionMsg._0_8_);
    iVar2 = ((int)sVar4 + -0x28) / 0x1e;
    version->number_of_extensions = iVar2;
    if (iVar2 == 0) {
      version->extensions = (char **)0x0;
    }
    else {
      ppcVar5 = (char **)safeMalloc((long)iVar2 << 3);
      version->extensions = ppcVar5;
      ppcStack_80 = version->extensions;
      for (local_84 = 0x28; sVar4 = size_slBuffer((slBuffer *)versionMsg._0_8_),
          local_84 < (int)sVar4; local_84 = local_84 + 0x1e) {
        pcVar3 = getAllocatedStringCopy((char *)(source + local_84));
        *ppcStack_80 = pcVar3;
        ppcStack_80 = ppcStack_80 + 1;
      }
      *ppcStack_80 = (char *)0x0;
    }
    _verbosity_local = makeOkReturn();
  }
  return _verbosity_local;
}

Assistant:

extern slReturn ubxGetVersion(int fdPort, int verbosity, ubxVersion* version) {

    ubxType type = { UBX_MON, UBX_MON_VER };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(type, body);
    ubxMsg versionMsg;
    slReturn result = pollUbx(fdPort, msg, MON_VER_MAX_MS, &versionMsg);
    if (isErrorReturn(result)) return result;

    // decode the message and print the results...
    char* buf = (char *) buffer_slBuffer(versionMsg.body);

    version->software = getAllocatedStringCopy(buf);
    version->hardware = getAllocatedStringCopy(buf + 30);

    // calculate the number of extension entries we have...
    int ne = ((int) size_slBuffer(versionMsg.body) - 40) / 30;
    version->number_of_extensions = ne;
    if (ne == 0)
        version->extensions = NULL;
    else {
        version->extensions = safeMalloc((size_t) (sizeof(buf) * ne));
        char** ptr = version->extensions;
        for (int i = 40; i < (int) size_slBuffer(versionMsg.body); i += 30) {
            *ptr = getAllocatedStringCopy(buf + i);
            ptr++;
        }
        *ptr = NULL;
    }

    return makeOkReturn();
}